

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O0

void obj_moveoutletfirst(t_object *x,_outlet *o)

{
  _outlet *local_20;
  _outlet *o2;
  _outlet *o_local;
  t_object *x_local;
  
  if (x->te_outlet != o) {
    for (local_20 = x->te_outlet; local_20 != (_outlet *)0x0; local_20 = local_20->o_next) {
      if (local_20->o_next == o) {
        local_20->o_next = o->o_next;
        o->o_next = x->te_outlet;
        x->te_outlet = o;
        return;
      }
    }
  }
  return;
}

Assistant:

void obj_moveoutletfirst(t_object *x, t_outlet *o)
{
    t_outlet *o2;
    if (x->ob_outlet == o) return;
    else for (o2 = x->ob_outlet; o2; o2 = o2->o_next)
        if (o2->o_next == o)
    {
        o2->o_next = o->o_next;
        o->o_next = x->ob_outlet;
        x->ob_outlet = o;
        return;
    }
}